

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_filesystem.cpp
# Opt level: O3

path * __thiscall Omega_h::filesystem::path::filename(path *__return_storage_ptr__,path *this)

{
  long lVar1;
  string local_38;
  
  lVar1 = std::__cxx11::string::rfind((char)this,0x2f);
  if (lVar1 == -1) {
    path(__return_storage_ptr__,&this->impl);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_38,(ulong)this);
    path(__return_storage_ptr__,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

path path::filename() const {
  auto const last_sep_pos = impl.find_last_of(preferred_separator);
  if (last_sep_pos == std::string::npos) return impl;
  return impl.substr(last_sep_pos + 1, std::string::npos);
}